

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutOracle.c
# Opt level: O2

void Cut_OracleTryDroppingCuts(Cut_Oracle_t *p,int Node)

{
  int iVar1;
  
  if (p->vFanCounts == (Vec_Int_t *)0x0) {
    __assert_fail("p->vFanCounts",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cut/cutOracle.c"
                  ,0x19a,"void Cut_OracleTryDroppingCuts(Cut_Oracle_t *, int)");
  }
  iVar1 = Vec_IntEntry(p->vFanCounts,Node);
  if (0 < iVar1) {
    if (iVar1 + -1 == 0) {
      Cut_OracleFreeCuts(p,Node);
    }
    if ((-1 < Node) && (Node < p->vFanCounts->nSize)) {
      p->vFanCounts->pArray[(uint)Node] = iVar1 + -1;
      return;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  __assert_fail("nFanouts > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/cut/cutOracle.c"
                ,0x19c,"void Cut_OracleTryDroppingCuts(Cut_Oracle_t *, int)");
}

Assistant:

void Cut_OracleTryDroppingCuts( Cut_Oracle_t * p, int Node )
{
    int nFanouts;
    assert( p->vFanCounts );
    nFanouts = Vec_IntEntry( p->vFanCounts, Node );
    assert( nFanouts > 0 );
    if ( --nFanouts == 0 )
        Cut_OracleFreeCuts( p, Node );
    Vec_IntWriteEntry( p->vFanCounts, Node, nFanouts );
}